

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

kp_error_t kp_cfg_find(kp_ctx *ctx,char *path,char *cfg_path,size_t size)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  ulong in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  stat stats;
  char *dir;
  char abspath [4096];
  stat local_10c8;
  char *local_1038;
  ulong local_1030;
  char *local_1028;
  long local_1018;
  kp_error_t local_100c;
  char local_1008 [4096];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1038 = (char *)0x0;
  local_1030 = in_RCX;
  local_1028 = in_RDX;
  local_1018 = in_RDI;
  uVar2 = strlcat(in_RDX,in_RSI,in_RCX);
  if (uVar2 < local_1030) {
    do {
      local_1038 = strrchr(local_1028,0x2f);
      bVar4 = true;
      if ((local_1038 == (char *)0x0) && (bVar4 = local_1028 != (char *)0x0, bVar4)) {
        local_1038 = local_1028;
      }
      if (!bVar4) {
LAB_00103ecb:
        if (local_1038 == (char *)0x0) {
          piVar3 = __errno_location();
          *piVar3 = 2;
          local_100c = 5;
        }
        else {
          local_100c = 0;
        }
        goto LAB_00103ef9;
      }
      memset(local_1008,0,0x1000);
      *local_1038 = '\0';
      iVar1 = snprintf(local_1008,0x1000,"%s/%s/.config",local_1018 + 4,local_1028);
      if (0xfff < iVar1) {
        piVar3 = __errno_location();
        *piVar3 = 0x24;
        local_100c = 5;
        goto LAB_00103ef9;
      }
      iVar1 = stat(local_1008,&local_10c8);
      if (-1 < iVar1) goto LAB_00103ecb;
      piVar3 = __errno_location();
    } while (*piVar3 == 2);
    local_100c = 5;
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x24;
    local_100c = 5;
  }
LAB_00103ef9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_100c;
}

Assistant:

kp_error_t
kp_cfg_find(struct kp_ctx *ctx, const char *path, char *cfg_path, size_t size)
{
	char *dir = NULL;
	struct stat stats;

	if (strlcat(cfg_path, path, size) >= size) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	while ((dir = strrchr(cfg_path, '/')) != NULL
	       || ((dir != cfg_path) && (dir = cfg_path))) {
		char abspath[PATH_MAX] = "";

		dir[0] = '\0';

		if (snprintf(abspath, PATH_MAX, "%s/%s/" KP_CONFIG_SAFE_NAME,
                    ctx->ws_path, cfg_path) >= PATH_MAX) {
			errno = ENAMETOOLONG;
			return KP_ERRNO;
		}

		if (stat(abspath, &stats) < 0) {
			if (errno == ENOENT) {
				continue;
			}
			return KP_ERRNO;
		} else {
			break;
		}
	}

	if (dir == NULL) {
		errno = ENOENT;
		return KP_ERRNO;
	}

	return KP_SUCCESS;
}